

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceBundle *
ures_openWithType(UResourceBundle *r,char *path,char *localeID,UResOpenType openType,
                 UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  byte local_ea;
  UBool local_e9;
  char local_e8 [7];
  UBool isStackObject;
  char canonLocaleID [157];
  UResourceDataEntry *local_40;
  UResourceDataEntry *entry;
  UErrorCode *status_local;
  UResOpenType openType_local;
  char *localeID_local;
  char *path_local;
  UResourceBundle *r_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (openType == URES_OPEN_DIRECT) {
      local_40 = entryOpenDirect(path,localeID,status);
    }
    else {
      uloc_getBaseName_63(localeID,local_e8,0x9d,status);
      UVar1 = U_FAILURE(*status);
      if ((UVar1 != '\0') || (*status == U_STRING_NOT_TERMINATED_WARNING)) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return (UResourceBundle *)0x0;
      }
      local_40 = entryOpen(path,local_e8,openType,status);
    }
    UVar1 = U_FAILURE(*status);
    if (UVar1 == '\0') {
      if (local_40 == (UResourceDataEntry *)0x0) {
        *status = U_MISSING_RESOURCE_ERROR;
        r_local = (UResourceBundle *)0x0;
      }
      else {
        if (r == (UResourceBundle *)0x0) {
          path_local = (char *)uprv_malloc_63(200);
          if (path_local == (char *)0x0) {
            entryClose(local_40);
            *status = U_MEMORY_ALLOCATION_ERROR;
            return (UResourceBundle *)0x0;
          }
          local_e9 = '\0';
        }
        else {
          local_e9 = ures_isStackObject(r);
          ures_closeBundle(r,'\0');
          path_local = (char *)r;
        }
        memset(path_local,0,200);
        ures_setIsStackObject((UResourceBundle *)path_local,local_e9);
        *(UResourceDataEntry **)(path_local + 8) = local_40;
        *(UResourceDataEntry **)(path_local + 0x18) = local_40;
        memcpy(path_local + 0x28,&local_40->fData,0x40);
        local_ea = 0;
        if (openType != URES_OPEN_DIRECT) {
          local_ea = path_local[0x60] != '\0' ^ 0xff;
        }
        path_local[0xb0] = local_ea & 1;
        path_local[0xb1] = '\x01';
        *(undefined4 *)(path_local + 0xac) = *(undefined4 *)(path_local + 0x48);
        iVar2 = res_countArrayItems_63
                          ((ResourceData *)(path_local + 0x28),*(Resource *)(path_local + 0xac));
        *(int32_t *)(path_local + 0xc0) = iVar2;
        path_local[0xbc] = -1;
        path_local[0xbd] = -1;
        path_local[0xbe] = -1;
        path_local[0xbf] = -1;
        r_local = (UResourceBundle *)path_local;
      }
    }
    else {
      r_local = (UResourceBundle *)0x0;
    }
  }
  else {
    r_local = (UResourceBundle *)0x0;
  }
  return r_local;
}

Assistant:

static UResourceBundle*
ures_openWithType(UResourceBundle *r, const char* path, const char* localeID,
                  UResOpenType openType, UErrorCode* status) {
    if(U_FAILURE(*status)) {
        return NULL;
    }

    UResourceDataEntry *entry;
    if(openType != URES_OPEN_DIRECT) {
        /* first "canonicalize" the locale ID */
        char canonLocaleID[ULOC_FULLNAME_CAPACITY];
        uloc_getBaseName(localeID, canonLocaleID, UPRV_LENGTHOF(canonLocaleID), status);
        if(U_FAILURE(*status) || *status == U_STRING_NOT_TERMINATED_WARNING) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return NULL;
        }
        entry = entryOpen(path, canonLocaleID, openType, status);
    } else {
        entry = entryOpenDirect(path, localeID, status);
    }
    if(U_FAILURE(*status)) {
        return NULL;
    }
    if(entry == NULL) {
        *status = U_MISSING_RESOURCE_ERROR;
        return NULL;
    }

    UBool isStackObject;
    if(r == NULL) {
        r = (UResourceBundle *)uprv_malloc(sizeof(UResourceBundle));
        if(r == NULL) {
            entryClose(entry);
            *status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        isStackObject = FALSE;
    } else {  // fill-in
        isStackObject = ures_isStackObject(r);
        ures_closeBundle(r, FALSE);
    }
    uprv_memset(r, 0, sizeof(UResourceBundle));
    ures_setIsStackObject(r, isStackObject);

    r->fTopLevelData = r->fData = entry;
    uprv_memcpy(&r->fResData, &entry->fData, sizeof(ResourceData));
    r->fHasFallback = openType != URES_OPEN_DIRECT && !r->fResData.noFallback;
    r->fIsTopLevel = TRUE;
    r->fRes = r->fResData.rootRes;
    r->fSize = res_countArrayItems(&(r->fResData), r->fRes);
    r->fIndex = -1;

    return r;
}